

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O1

void __thiscall trieste::logging::Log::end(Log *this)

{
  char cVar1;
  
  if (this->print == Active) {
    cVar1 = (char)this + ' ';
    std::ios::widen((char)*(undefined8 *)(*(long *)((this->strstream).data + 0x10) + -0x18) + cVar1)
    ;
    std::ostream::put(cVar1);
    std::ostream::flush();
    if (dump_callback_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*dump_callback_abi_cxx11_._M_invoker)
              ((_Any_data *)&dump_callback_abi_cxx11_,
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &this->strstream);
  }
  (*(code *)**(undefined8 **)(this->strstream).data)(&this->strstream);
  return;
}

Assistant:

SNMALLOC_SLOW_PATH void end()
    {
      if (print == Status::Active)
      {
        strstream.get() << std::endl;
        dump_callback(strstream.get());
      }
      strstream.destruct();
    }